

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGSpatialSort.cpp
# Opt level: O0

void __thiscall
Assimp::SGSpatialSort::FindPositions
          (SGSpatialSort *this,aiVector3D *pPosition,uint32_t pSG,float pRadius,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *poResults,bool exactMatch)

{
  uint uVar1;
  bool bVar2;
  const_reference pvVar3;
  size_type sVar4;
  pointer pEVar5;
  float fVar6;
  float fVar7;
  aiVector3t<float> aVar8;
  aiVector3t<float> local_c0;
  aiVector3t<float> local_ac;
  aiVector3t<float> local_a0;
  aiVector3t<float> local_8c;
  aiVector3t<float> local_80;
  aiVector3t<float> local_6c;
  __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
  local_60;
  const_iterator end;
  __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
  local_50;
  const_iterator it;
  uint local_40;
  float squareEpsilon;
  uint binaryStepSize;
  uint index;
  float maxDist;
  float minDist;
  float dist;
  bool exactMatch_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *poResults_local;
  float pRadius_local;
  uint32_t pSG_local;
  aiVector3D *pPosition_local;
  SGSpatialSort *this_local;
  
  fVar6 = ::operator*(pPosition,&this->mPlaneNormal);
  fVar7 = fVar6 - pRadius;
  fVar6 = fVar6 + pRadius;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(poResults);
  bVar2 = std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>::
          empty(&this->mPositions);
  if (((!bVar2) &&
      (pvVar3 = std::
                vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>
                ::front(&this->mPositions), pvVar3->mDistance <= fVar6)) &&
     (pvVar3 = std::
               vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>::
               back(&this->mPositions), fVar7 < pvVar3->mDistance || fVar7 == pvVar3->mDistance)) {
    sVar4 = std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>
            ::size(&this->mPositions);
    squareEpsilon = ABS((float)(sVar4 >> 1));
    sVar4 = std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>
            ::size(&this->mPositions);
    for (local_40 = (uint)(sVar4 >> 2) & 0x3fffffff; 1 < local_40; local_40 = local_40 >> 1) {
      pvVar3 = std::
               vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>::
               operator[](&this->mPositions,(ulong)(uint)squareEpsilon);
      uVar1 = local_40;
      if (fVar7 <= pvVar3->mDistance) {
        uVar1 = -local_40;
      }
      squareEpsilon = (float)(uVar1 + (int)squareEpsilon);
    }
    while( true ) {
      bVar2 = false;
      if (squareEpsilon != 0.0) {
        pvVar3 = std::
                 vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>
                 ::operator[](&this->mPositions,(ulong)(uint)squareEpsilon);
        bVar2 = fVar7 < pvVar3->mDistance;
      }
      if (!bVar2) break;
      squareEpsilon = (float)((int)squareEpsilon + -1);
    }
    while( true ) {
      sVar4 = std::
              vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>::
              size(&this->mPositions);
      bVar2 = false;
      if ((ulong)(uint)squareEpsilon < sVar4 - 1) {
        pvVar3 = std::
                 vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>
                 ::operator[](&this->mPositions,(ulong)(uint)squareEpsilon);
        bVar2 = pvVar3->mDistance < fVar7;
      }
      if (!bVar2) break;
      squareEpsilon = (float)((int)squareEpsilon + 1);
    }
    it._M_current._4_4_ = pRadius * pRadius;
    end = std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>::
          begin(&this->mPositions);
    local_50 = __gnu_cxx::
               __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
               ::operator+(&end,(ulong)(uint)squareEpsilon);
    local_60._M_current =
         (Entry *)std::
                  vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>
                  ::end(&this->mPositions);
    if (exactMatch) {
      do {
        pEVar5 = __gnu_cxx::
                 __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
                 ::operator->(&local_50);
        if (fVar6 <= pEVar5->mDistance) {
          return;
        }
        pEVar5 = __gnu_cxx::
                 __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
                 ::operator->(&local_50);
        aVar8 = ::operator-(&pEVar5->mPosition,pPosition);
        local_80._0_8_ = aVar8._0_8_;
        local_6c.x = local_80.x;
        local_6c.y = local_80.y;
        local_80.z = aVar8.z;
        local_6c.z = local_80.z;
        local_80 = aVar8;
        fVar7 = aiVector3t<float>::SquareLength(&local_6c);
        bVar2 = false;
        if (fVar7 < it._M_current._4_4_) {
          pEVar5 = __gnu_cxx::
                   __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
                   ::operator->(&local_50);
          bVar2 = pEVar5->mSmoothGroups == pSG;
        }
        if (bVar2) {
          pEVar5 = __gnu_cxx::
                   __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
                   ::operator->(&local_50);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (poResults,&pEVar5->mIndex);
        }
        __gnu_cxx::
        __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
        ::operator++(&local_50);
        bVar2 = __gnu_cxx::operator==(&local_60,&local_50);
      } while (!bVar2);
    }
    else if (pSG == 0) {
      do {
        pEVar5 = __gnu_cxx::
                 __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
                 ::operator->(&local_50);
        if (fVar6 <= pEVar5->mDistance) {
          return;
        }
        pEVar5 = __gnu_cxx::
                 __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
                 ::operator->(&local_50);
        aVar8 = ::operator-(&pEVar5->mPosition,pPosition);
        local_a0._0_8_ = aVar8._0_8_;
        local_8c.x = local_a0.x;
        local_8c.y = local_a0.y;
        local_a0.z = aVar8.z;
        local_8c.z = local_a0.z;
        local_a0 = aVar8;
        fVar7 = aiVector3t<float>::SquareLength(&local_8c);
        if (fVar7 < it._M_current._4_4_) {
          pEVar5 = __gnu_cxx::
                   __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
                   ::operator->(&local_50);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (poResults,&pEVar5->mIndex);
        }
        __gnu_cxx::
        __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
        ::operator++(&local_50);
        bVar2 = __gnu_cxx::operator==(&local_60,&local_50);
      } while (!bVar2);
    }
    else {
      do {
        pEVar5 = __gnu_cxx::
                 __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
                 ::operator->(&local_50);
        if (fVar6 <= pEVar5->mDistance) {
          return;
        }
        pEVar5 = __gnu_cxx::
                 __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
                 ::operator->(&local_50);
        aVar8 = ::operator-(&pEVar5->mPosition,pPosition);
        local_c0._0_8_ = aVar8._0_8_;
        local_ac.x = local_c0.x;
        local_ac.y = local_c0.y;
        local_c0.z = aVar8.z;
        local_ac.z = local_c0.z;
        fVar7 = aiVector3t<float>::SquareLength(&local_ac);
        bVar2 = false;
        if (fVar7 < it._M_current._4_4_) {
          pEVar5 = __gnu_cxx::
                   __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
                   ::operator->(&local_50);
          bVar2 = true;
          if ((pEVar5->mSmoothGroups & pSG) == 0) {
            pEVar5 = __gnu_cxx::
                     __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
                     ::operator->(&local_50);
            bVar2 = pEVar5->mSmoothGroups == 0;
          }
        }
        if (bVar2) {
          pEVar5 = __gnu_cxx::
                   __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
                   ::operator->(&local_50);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (poResults,&pEVar5->mIndex);
        }
        __gnu_cxx::
        __normal_iterator<const_Assimp::SGSpatialSort::Entry_*,_std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>_>
        ::operator++(&local_50);
        bVar2 = __gnu_cxx::operator==(&local_60,&local_50);
      } while (!bVar2);
    }
  }
  return;
}

Assistant:

void SGSpatialSort::FindPositions( const aiVector3D& pPosition,
    uint32_t pSG,
    float pRadius,
    std::vector<unsigned int>& poResults,
    bool exactMatch /*= false*/) const
{
    float dist = pPosition * mPlaneNormal;
    float minDist = dist - pRadius, maxDist = dist + pRadius;

    // clear the array
    poResults.clear();

    // quick check for positions outside the range
    if( mPositions.empty() )
        return;
    if( maxDist < mPositions.front().mDistance)
        return;
    if( minDist > mPositions.back().mDistance)
        return;

    // do a binary search for the minimal distance to start the iteration there
    unsigned int index = (unsigned int)mPositions.size() / 2;
    unsigned int binaryStepSize = (unsigned int)mPositions.size() / 4;
    while( binaryStepSize > 1)
    {
        if( mPositions[index].mDistance < minDist)
            index += binaryStepSize;
        else
            index -= binaryStepSize;

        binaryStepSize /= 2;
    }

    // depending on the direction of the last step we need to single step a bit back or forth
    // to find the actual beginning element of the range
    while( index > 0 && mPositions[index].mDistance > minDist)
        index--;
    while( index < (mPositions.size() - 1) && mPositions[index].mDistance < minDist)
        index++;

    // Mow start iterating from there until the first position lays outside of the distance range.
    // Add all positions inside the distance range within the given radius to the result aray

    float squareEpsilon = pRadius * pRadius;
    std::vector<Entry>::const_iterator it  = mPositions.begin() + index;
    std::vector<Entry>::const_iterator end = mPositions.end();

    if (exactMatch)
    {
        while( it->mDistance < maxDist)
        {
            if((it->mPosition - pPosition).SquareLength() < squareEpsilon && it->mSmoothGroups == pSG)
            {
                poResults.push_back( it->mIndex);
            }
            ++it;
            if( end == it )break;
        }
    }
    else
    {
        // if the given smoothing group is 0, we'll return all surrounding vertices
        if (!pSG)
        {
            while( it->mDistance < maxDist)
            {
                if((it->mPosition - pPosition).SquareLength() < squareEpsilon)
                    poResults.push_back( it->mIndex);
                ++it;
                if( end == it)break;
            }
        }
        else while( it->mDistance < maxDist)
        {
            if((it->mPosition - pPosition).SquareLength() < squareEpsilon &&
                (it->mSmoothGroups & pSG || !it->mSmoothGroups))
            {
                poResults.push_back( it->mIndex);
            }
            ++it;
            if( end == it)break;
        }
    }
}